

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

void p2sc_strip_strings(char ***sss)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long *in_RDI;
  GArray *a;
  guint n;
  guint i;
  char *s;
  char **ss;
  uint local_1c;
  char *local_18;
  long local_10;
  long *local_8;
  
  local_10 = *in_RDI;
  local_8 = in_RDI;
  uVar1 = g_strv_length(local_10);
  uVar2 = g_array_sized_new(1,0,8,uVar1);
  for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
    uVar3 = g_strchug(*(undefined8 *)(local_10 + (ulong)local_1c * 8));
    local_18 = (char *)g_strchomp(uVar3);
    if (*local_18 == '\0') {
      g_free(local_18);
    }
    else {
      g_array_append_vals(uVar2,&local_18,1);
    }
  }
  g_free(local_10);
  lVar4 = g_array_free(uVar2,0);
  *local_8 = lVar4;
  return;
}

Assistant:

void p2sc_strip_strings(char ***sss) {
    char **ss = *sss, *s;
    guint i, n = g_strv_length(ss);
    GArray *a = g_array_sized_new(TRUE, FALSE, sizeof(char *), n);

    for (i = 0; i < n; ++i) {
        s = g_strstrip(ss[i]);
        if (!*s)
            g_free(s);
        else
            g_array_append_val(a, s);
    }
    g_free(ss);
    *sss = (char **) g_array_free(a, FALSE);
}